

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_const_impl.h
# Opt level: O1

void secp256k1_ecmult_const(secp256k1_gej *r,secp256k1_ge *a,secp256k1_scalar *q)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  uint64_t uVar70;
  uint64_t uVar71;
  undefined1 auVar72 [16];
  secp256k1_fe *r_00;
  byte bVar73;
  long lVar74;
  ulong uVar75;
  ulong uVar76;
  int iVar77;
  uint uVar78;
  uint64_t *puVar79;
  secp256k1_fe *psVar80;
  uint uVar81;
  ulong uVar82;
  int iVar83;
  ulong uVar84;
  long lVar85;
  ulong uVar86;
  bool bVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  uint64_t uVar96;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  ulong uVar101;
  undefined4 uVar106;
  ulong uVar107;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined4 uVar110;
  uint negative;
  secp256k1_fe global_z;
  secp256k1_scalar v2;
  secp256k1_scalar v1;
  secp256k1_scalar s;
  secp256k1_ge pre_a_lam [16];
  secp256k1_ge pre_a [16];
  undefined1 local_c38 [16];
  undefined1 local_c28 [16];
  ulong local_c18;
  ulong uStack_c10;
  uint64_t uStack_c08;
  uint64_t uStack_c00;
  uint64_t uStack_bf8;
  uint64_t local_bf0;
  int local_be8;
  secp256k1_fe local_bc0;
  secp256k1_scalar local_b98;
  secp256k1_scalar local_b78;
  secp256k1_scalar local_b58;
  secp256k1_fe local_b38;
  ulong local_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 local_af0;
  undefined1 auStack_ae0 [16];
  undefined1 auStack_ad0 [16];
  ulong auStack_ac0 [2];
  undefined1 auStack_ab0 [16];
  undefined1 auStack_aa0 [1256];
  secp256k1_ge local_5b8;
  undefined1 auStack_560 [16];
  undefined1 auStack_550 [16];
  ulong auStack_540 [2];
  undefined1 auStack_530 [16];
  undefined1 auStack_520 [1264];
  
  bVar73 = 0;
  if (a->infinity == 0) {
    secp256k1_scalar_add(&local_b58,q,&secp256k1_ecmult_const_K);
    secp256k1_scalar_half(&local_b58,&local_b58);
    secp256k1_scalar_split_lambda(&local_b78,&local_b98,&local_b58);
    secp256k1_scalar_add(&local_b78,&local_b78,&secp256k1_ecmult_const::S_OFFSET);
    secp256k1_scalar_add(&local_b98,&local_b98,&secp256k1_ecmult_const::S_OFFSET);
    r->infinity = a->infinity;
    uVar96 = (a->x).n[1];
    uVar70 = (a->x).n[2];
    uVar71 = (a->x).n[3];
    (r->x).n[0] = (a->x).n[0];
    (r->x).n[1] = uVar96;
    (r->x).n[2] = uVar70;
    (r->x).n[3] = uVar71;
    (r->x).n[4] = (a->x).n[4];
    uVar96 = (a->y).n[1];
    uVar70 = (a->y).n[2];
    uVar71 = (a->y).n[3];
    (r->y).n[0] = (a->y).n[0];
    (r->y).n[1] = uVar96;
    (r->y).n[2] = uVar70;
    (r->y).n[3] = uVar71;
    (r->y).n[4] = (a->y).n[4];
    (r->z).n[0] = 1;
    (r->z).n[1] = 0;
    (r->z).n[2] = 0;
    (r->z).n[3] = 0;
    (r->z).n[4] = 0;
    secp256k1_ecmult_odd_multiples_table(0x10,&local_5b8,&local_b38,&local_bc0,r);
    secp256k1_ge_table_set_globalz(0x10,&local_5b8,&local_b38);
    lVar85 = 0;
    do {
      r_00 = (secp256k1_fe *)((long)local_b38.n + lVar85);
      puVar79 = (uint64_t *)((long)local_5b8.x.n + lVar85);
      psVar80 = r_00;
      for (lVar74 = 0xb; lVar74 != 0; lVar74 = lVar74 + -1) {
        psVar80->n[0] = *puVar79;
        puVar79 = puVar79 + (ulong)bVar73 * -2 + 1;
        psVar80 = (secp256k1_fe *)((long)psVar80 + ((ulong)bVar73 * -2 + 1) * 8);
      }
      secp256k1_fe_impl_mul(r_00,r_00,&secp256k1_const_beta);
      lVar85 = lVar85 + 0x58;
    } while (lVar85 != 0x580);
    iVar83 = 0x19;
    do {
      uVar78 = (uint)(iVar83 * 5) >> 6;
      bVar73 = (byte)(iVar83 * 5) & 0x3f;
      uVar75 = local_b78.d[uVar78] >> bVar73;
      uVar81 = iVar83 * 5 + 4U >> 6;
      if (uVar81 != uVar78) {
        uVar75 = uVar75 | local_b78.d[(ulong)uVar78 + 1] << (-bVar73 & 0x3f);
      }
      uVar82 = local_b98.d[uVar78] >> bVar73;
      if (uVar81 != uVar78) {
        uVar82 = uVar82 | local_b98.d[(ulong)uVar78 + 1] << (-bVar73 & 0x3f);
      }
      uVar78 = (uint)((uVar75 & 0x10) == 0);
      local_c28._8_8_ = local_5b8.x.n[3];
      local_c28._0_8_ = local_5b8.x.n[2];
      local_c38._8_8_ = local_5b8.x.n[1];
      local_c38._0_8_ = local_5b8.x.n[0];
      auVar91._8_8_ = local_5b8.y.n[2];
      auVar91._0_8_ = local_5b8.y.n[1];
      auVar88._8_8_ = local_5b8.y.n[4];
      auVar88._0_8_ = local_5b8.y.n[3];
      lVar85 = 0;
      local_c18 = local_5b8.x.n[4];
      uVar96 = local_5b8.y.n[0];
      do {
        bVar87 = (ulong)((-uVar78 ^ (uint)uVar75) & 0xf) * 0x58 + -0x58 == lVar85;
        uVar107 = (ulong)bVar87;
        uVar101 = (ulong)bVar87;
        uVar76 = -uVar101;
        uVar1 = -uVar107;
        uVar101 = uVar101 - 1;
        uVar107 = uVar107 - 1;
        uVar106 = (undefined4)(uVar101 >> 0x20);
        auVar102._8_4_ = (undefined4)uVar107;
        auVar102._12_4_ = (undefined4)(uVar107 >> 0x20);
        auVar58._8_4_ = (int)uVar101;
        auVar58._0_8_ = uVar101;
        auVar58._12_4_ = uVar106;
        uVar110 = (undefined4)(uVar76 >> 0x20);
        auVar62._8_4_ = (int)uVar76;
        auVar62._0_8_ = uVar76;
        auVar62._12_4_ = uVar110;
        local_c38 = *(undefined1 (*) [16])(auStack_560 + lVar85) & auVar62 | local_c38 & auVar58;
        auVar59._8_4_ = (int)uVar101;
        auVar59._0_8_ = uVar101;
        auVar59._12_4_ = uVar106;
        auVar63._8_4_ = (int)uVar76;
        auVar63._0_8_ = uVar76;
        auVar63._12_4_ = uVar110;
        local_c28 = *(undefined1 (*) [16])(auStack_550 + lVar85) & auVar63 | local_c28 & auVar59;
        local_c18 = *(ulong *)((long)auStack_540 + lVar85) & uVar76 | local_c18 & uVar101;
        uVar96 = *(ulong *)((long)auStack_540 + lVar85 + 8) & uVar1 | uVar96 & uVar107;
        auVar102._0_8_ = uVar107;
        auVar108._8_4_ = (int)uVar1;
        auVar108._0_8_ = uVar1;
        auVar108._12_4_ = (int)(uVar1 >> 0x20);
        auVar91 = *(undefined1 (*) [16])(auStack_530 + lVar85) & auVar108 | auVar91 & auVar102;
        auVar88 = *(undefined1 (*) [16])(auStack_520 + lVar85) & auVar108 | auVar88 & auVar102;
        lVar85 = lVar85 + 0x58;
      } while (lVar85 != 0x528);
      local_be8 = 0;
      auVar94._0_8_ = 0x3ffffffffffffc - auVar91._0_8_;
      auVar94._8_8_ = 0x3ffffffffffffc - auVar91._8_8_;
      auVar97._0_8_ = 0x3ffffffffffffc - auVar88._0_8_;
      auVar97._8_8_ = 0x3fffffffffffc - auVar88._8_8_;
      uVar75 = (long)(int)uVar78 - 1;
      uVar76 = -(long)(int)uVar78;
      uStack_c10 = 0x3ffffbfffff0bc - uVar96 & uVar76 | uVar96 & uVar75;
      auVar99._8_4_ = (int)uVar75;
      auVar99._0_8_ = uVar75;
      auVar99._12_4_ = (int)(uVar75 >> 0x20);
      auVar103._8_4_ = (int)uVar76;
      auVar103._0_8_ = uVar76;
      auVar103._12_4_ = (int)(uVar76 >> 0x20);
      auVar91 = auVar94 & auVar103 | auVar91 & auVar99;
      uStack_c08 = auVar91._0_8_;
      uStack_c00 = auVar91._8_8_;
      auVar91 = auVar97 & auVar103 | auVar99 & auVar88;
      uStack_bf8 = auVar91._0_8_;
      local_bf0 = auVar91._8_8_;
      if (iVar83 == 0x19) {
        r->infinity = 0;
        (r->x).n[4] = local_c18;
        (r->x).n[2] = local_c28._0_8_;
        (r->x).n[3] = local_c28._8_8_;
        (r->x).n[0] = local_c38._0_8_;
        (r->x).n[1] = local_c38._8_8_;
        (r->y).n[0] = uStack_c10;
        (r->y).n[1] = uStack_c08;
        (r->y).n[2] = uStack_c00;
        (r->y).n[3] = uStack_bf8;
        (r->y).n[4] = local_bf0;
        (r->z).n[0] = 1;
        (r->z).n[3] = 0;
        (r->z).n[4] = 0;
        (r->z).n[1] = 0;
        (r->z).n[2] = 0;
      }
      else {
        iVar77 = 5;
        do {
          secp256k1_gej_double(r,r);
          iVar77 = iVar77 + -1;
        } while (iVar77 != 0);
        secp256k1_gej_add_ge(r,r,(secp256k1_ge *)local_c38);
      }
      uVar78 = (uint)((uVar82 & 0x10) == 0);
      local_c28._8_8_ = local_b38.n[3];
      local_c28._0_8_ = local_b38.n[2];
      local_c38._8_8_ = local_b38.n[1];
      local_c38._0_8_ = local_b38.n[0];
      auVar92._8_8_ = local_b00;
      auVar92._0_8_ = uStack_b08;
      auVar89._8_8_ = local_af0;
      auVar89._0_8_ = uStack_af8;
      lVar85 = 0;
      local_c18 = local_b38.n[4];
      uVar75 = local_b10;
      do {
        bVar87 = (ulong)((-uVar78 ^ (uint)uVar82) & 0xf) * 0x58 + -0x58 == lVar85;
        uVar107 = (ulong)bVar87;
        uVar101 = (ulong)bVar87;
        uVar76 = -uVar101;
        uVar1 = -uVar107;
        uVar101 = uVar101 - 1;
        uVar107 = uVar107 - 1;
        uVar106 = (undefined4)(uVar101 >> 0x20);
        auVar104._8_4_ = (undefined4)uVar107;
        auVar104._12_4_ = (undefined4)(uVar107 >> 0x20);
        auVar60._8_4_ = (int)uVar101;
        auVar60._0_8_ = uVar101;
        auVar60._12_4_ = uVar106;
        uVar110 = (undefined4)(uVar76 >> 0x20);
        auVar64._8_4_ = (int)uVar76;
        auVar64._0_8_ = uVar76;
        auVar64._12_4_ = uVar110;
        local_c38 = *(undefined1 (*) [16])(auStack_ae0 + lVar85) & auVar64 | local_c38 & auVar60;
        auVar61._8_4_ = (int)uVar101;
        auVar61._0_8_ = uVar101;
        auVar61._12_4_ = uVar106;
        auVar65._8_4_ = (int)uVar76;
        auVar65._0_8_ = uVar76;
        auVar65._12_4_ = uVar110;
        local_c28 = *(undefined1 (*) [16])(auStack_ad0 + lVar85) & auVar65 | local_c28 & auVar61;
        local_c18 = *(ulong *)((long)auStack_ac0 + lVar85) & uVar76 | local_c18 & uVar101;
        uVar75 = *(ulong *)((long)auStack_ac0 + lVar85 + 8) & uVar1 | uVar75 & uVar107;
        auVar104._0_8_ = uVar107;
        auVar109._8_4_ = (int)uVar1;
        auVar109._0_8_ = uVar1;
        auVar109._12_4_ = (int)(uVar1 >> 0x20);
        auVar92 = *(undefined1 (*) [16])(auStack_ab0 + lVar85) & auVar109 | auVar92 & auVar104;
        auVar89 = *(undefined1 (*) [16])(auStack_aa0 + lVar85) & auVar109 | auVar89 & auVar104;
        lVar85 = lVar85 + 0x58;
      } while (lVar85 != 0x528);
      local_be8 = 0;
      uVar82 = (long)(int)uVar78 - 1;
      uVar76 = -(long)(int)uVar78;
      auVar95._8_4_ = auVar92._0_4_;
      auVar95._0_8_ = uVar75;
      auVar95._12_4_ = auVar92._4_4_;
      auVar98._0_8_ = 0x3ffffbfffff0bc - uVar75;
      auVar98._8_8_ = 0x3ffffffffffffc - auVar95._8_8_;
      auVar100._8_4_ = (int)uVar82;
      auVar100._0_8_ = uVar82;
      auVar100._12_4_ = (int)(uVar82 >> 0x20);
      auVar105._8_4_ = (int)uVar76;
      auVar105._0_8_ = uVar76;
      auVar105._12_4_ = (int)(uVar76 >> 0x20);
      auVar91 = auVar98 & auVar105 | auVar95 & auVar100;
      uStack_c10 = auVar91._0_8_;
      uStack_c08 = auVar91._8_8_;
      auVar93._0_8_ = auVar92._8_8_;
      auVar93._8_4_ = auVar89._0_4_;
      auVar93._12_4_ = auVar89._4_4_;
      auVar90._0_8_ = 0x3ffffffffffffc - auVar93._0_8_;
      auVar90._8_8_ = 0x3ffffffffffffc - auVar93._8_8_;
      auVar91 = auVar90 & auVar105 | auVar93 & auVar100;
      uStack_c00 = auVar91._0_8_;
      uStack_bf8 = auVar91._8_8_;
      local_bf0 = uVar76 & 0x3fffffffffffc - auVar89._8_8_ | uVar82 & auVar89._8_8_;
      secp256k1_gej_add_ge(r,r,(secp256k1_ge *)local_c38);
      bVar87 = iVar83 != 0;
      iVar83 = iVar83 + -1;
    } while (bVar87);
    uVar75 = (r->z).n[0];
    uVar82 = (r->z).n[1];
    uVar76 = (r->z).n[2];
    uVar1 = (r->z).n[3];
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_bc0.n[3];
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar75;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_bc0.n[2];
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar82;
    uVar101 = (r->z).n[4];
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_bc0.n[1];
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar76;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_bc0.n[0];
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar1;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_bc0.n[4];
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar101;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = SUB168(auVar6 * auVar37,0);
    auVar58 = auVar3 * auVar34 + auVar2 * auVar33 + auVar4 * auVar35 + auVar5 * auVar36 +
              auVar7 * ZEXT816(0x1000003d10);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_bc0.n[4];
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar75;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_bc0.n[3];
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar82;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_bc0.n[2];
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar76;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_bc0.n[1];
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar1;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_bc0.n[0];
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar101;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = SUB168(auVar6 * auVar37,8);
    auVar91 = auVar13 * ZEXT816(0x1000003d10000) +
              auVar12 * auVar42 + auVar11 * auVar41 + auVar10 * auVar40 + auVar9 * auVar39 +
              auVar8 * auVar38 + (auVar58 >> 0x34);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_bc0.n[0];
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar75;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_bc0.n[4];
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar82;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_bc0.n[3];
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar76;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_bc0.n[2];
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar1;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_bc0.n[1];
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uVar101;
    auVar88 = (auVar91 >> 0x34) +
              auVar18 * auVar47 + auVar17 * auVar46 + auVar16 * auVar45 + auVar15 * auVar44;
    uVar107 = auVar88._0_8_;
    uVar84 = auVar88._8_8_;
    auVar72._8_8_ = uVar84 >> 0x34;
    auVar72._0_8_ = uVar84 * 0x1000 | uVar107 >> 0x34;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar107 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar91._6_2_ & 0xf);
    auVar88 = auVar19 * ZEXT816(0x1000003d1) + auVar14 * auVar43;
    uVar107 = auVar88._0_8_;
    uVar84 = auVar88._8_8_;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = local_bc0.n[1];
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar75;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = local_bc0.n[0];
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar82;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_bc0.n[4];
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uVar76;
    auVar66._8_8_ = uVar84 >> 0x34;
    auVar66._0_8_ = uVar84 * 0x1000 | uVar107 >> 0x34;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = local_bc0.n[3];
    auVar51._8_8_ = 0;
    auVar51._0_8_ = uVar1;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = local_bc0.n[2];
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uVar101;
    auVar72 = auVar22 * auVar50 + auVar24 * auVar52 + auVar23 * auVar51 + auVar72;
    uVar84 = auVar72._0_8_;
    uVar86 = auVar72._8_8_;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar84 & 0xfffffffffffff;
    auVar66 = auVar25 * ZEXT816(0x1000003d10) + auVar20 * auVar48 + auVar21 * auVar49 + auVar66;
    auVar67._8_8_ = uVar86 >> 0x34;
    auVar67._0_8_ = uVar86 * 0x1000 | uVar84 >> 0x34;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = local_bc0.n[2];
    auVar53._8_8_ = 0;
    auVar53._0_8_ = uVar75;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_bc0.n[1];
    auVar54._8_8_ = 0;
    auVar54._0_8_ = uVar82;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_bc0.n[0];
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uVar76;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = local_bc0.n[4];
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uVar1;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = local_bc0.n[3];
    auVar57._8_8_ = 0;
    auVar57._0_8_ = uVar101;
    auVar67 = auVar30 * auVar57 + auVar29 * auVar56 + auVar67;
    (r->z).n[0] = uVar107 & 0xfffffffffffff;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = auVar67._0_8_;
    (r->z).n[1] = auVar66._0_8_ & 0xfffffffffffff;
    auVar88 = auVar31 * ZEXT816(0x1000003d10) +
              auVar28 * auVar55 + auVar26 * auVar53 + auVar27 * auVar54 + (auVar66 >> 0x34);
    auVar59 = auVar88 >> 0x34;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = auVar59._0_8_;
    (r->z).n[2] = auVar88._0_8_ & 0xfffffffffffff;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = auVar67._8_8_;
    auVar68._8_8_ = auVar59._8_8_;
    auVar68._0_8_ = auVar58._0_8_ & 0xfffffffffffff;
    auVar69 = auVar32 * ZEXT816(0x1000003d10000) + auVar68 + auVar69;
    uVar75 = auVar69._0_8_;
    (r->z).n[3] = uVar75 & 0xfffffffffffff;
    (r->z).n[4] = (auVar69._8_8_ << 0xc | uVar75 >> 0x34) + (auVar91._0_8_ & 0xffffffffffff);
  }
  else {
    r->infinity = 1;
    (r->x).n[0] = 0;
    (r->x).n[1] = 0;
    (r->x).n[2] = 0;
    (r->x).n[3] = 0;
    *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
    (r->y).n[1] = 0;
    (r->y).n[2] = 0;
    (r->y).n[3] = 0;
    (r->y).n[4] = 0;
    (r->z).n[0] = 0;
    (r->z).n[1] = 0;
    (r->z).n[2] = 0;
    (r->z).n[3] = 0;
    (r->z).n[4] = 0;
  }
  return;
}

Assistant:

static void secp256k1_ecmult_const(secp256k1_gej *r, const secp256k1_ge *a, const secp256k1_scalar *q) {
    /* The approach below combines the signed-digit logic from Mike Hamburg's
     * "Fast and compact elliptic-curve cryptography" (https://eprint.iacr.org/2012/309)
     * Section 3.3, with the GLV endomorphism.
     *
     * The idea there is to interpret the bits of a scalar as signs (1 = +, 0 = -), and compute a
     * point multiplication in that fashion. Let v be an n-bit non-negative integer (0 <= v < 2^n),
     * and v[i] its i'th bit (so v = sum(v[i] * 2^i, i=0..n-1)). Then define:
     *
     *   C_l(v, A) = sum((2*v[i] - 1) * 2^i*A, i=0..l-1)
     *
     * Then it holds that C_l(v, A) = sum((2*v[i] - 1) * 2^i*A, i=0..l-1)
     *                              = (2*sum(v[i] * 2^i, i=0..l-1) + 1 - 2^l) * A
     *                              = (2*v + 1 - 2^l) * A
     *
     * Thus, one can compute q*A as C_256((q + 2^256 - 1) / 2, A). This is the basis for the
     * paper's signed-digit multi-comb algorithm for multiplication using a precomputed table.
     *
     * It is appealing to try to combine this with the GLV optimization: the idea that a scalar
     * s can be written as s1 + lambda*s2, where lambda is a curve-specific constant such that
     * lambda*A is easy to compute, and where s1 and s2 are small. In particular we have the
     * secp256k1_scalar_split_lambda function which performs such a split with the resulting s1
     * and s2 in range (-2^128, 2^128) mod n. This does work, but is uninteresting:
     *
     *   To compute q*A:
     *   - Let s1, s2 = split_lambda(q)
     *   - Let R1 = C_256((s1 + 2^256 - 1) / 2, A)
     *   - Let R2 = C_256((s2 + 2^256 - 1) / 2, lambda*A)
     *   - Return R1 + R2
     *
     * The issue is that while s1 and s2 are small-range numbers, (s1 + 2^256 - 1) / 2 (mod n)
     * and (s2 + 2^256 - 1) / 2 (mod n) are not, undoing the benefit of the splitting.
     *
     * To make it work, we want to modify the input scalar q first, before splitting, and then only
     * add a 2^128 offset of the split results (so that they end up in the single 129-bit range
     * [0,2^129]). A slightly smaller offset would work due to the bounds on the split, but we pick
     * 2^128 for simplicity. Let s be the scalar fed to split_lambda, and f(q) the function to
     * compute it from q:
     *
     *   To compute q*A:
     *   - Compute s = f(q)
     *   - Let s1, s2 = split_lambda(s)
     *   - Let v1 = s1 + 2^128 (mod n)
     *   - Let v2 = s2 + 2^128 (mod n)
     *   - Let R1 = C_l(v1, A)
     *   - Let R2 = C_l(v2, lambda*A)
     *   - Return R1 + R2
     *
     * l will thus need to be at least 129, but we may overshoot by a few bits (see
     * further), so keep it as a variable.
     *
     * To solve for s, we reason:
     *     q*A  = R1 + R2
     * <=> q*A  = C_l(s1 + 2^128, A) + C_l(s2 + 2^128, lambda*A)
     * <=> q*A  = (2*(s1 + 2^128) + 1 - 2^l) * A + (2*(s2 + 2^128) + 1 - 2^l) * lambda*A
     * <=> q*A  = (2*(s1 + s2*lambda) + (2^129 + 1 - 2^l) * (1 + lambda)) * A
     * <=> q    = 2*(s1 + s2*lambda) + (2^129 + 1 - 2^l) * (1 + lambda) (mod n)
     * <=> q    = 2*s + (2^129 + 1 - 2^l) * (1 + lambda) (mod n)
     * <=> s    = (q + (2^l - 2^129 - 1) * (1 + lambda)) / 2 (mod n)
     * <=> f(q) = (q + K) / 2 (mod n)
     *            where K = (2^l - 2^129 - 1)*(1 + lambda) (mod n)
     *
     * We will process the computation of C_l(v1, A) and C_l(v2, lambda*A) in groups of
     * ECMULT_CONST_GROUP_SIZE, so we set l to the smallest multiple of ECMULT_CONST_GROUP_SIZE
     * that is not less than 129; this equals ECMULT_CONST_BITS.
     */

    /* The offset to add to s1 and s2 to make them non-negative. Equal to 2^128. */
    static const secp256k1_scalar S_OFFSET = SECP256K1_SCALAR_CONST(0, 0, 0, 1, 0, 0, 0, 0);
    secp256k1_scalar s, v1, v2;
    secp256k1_ge pre_a[ECMULT_CONST_TABLE_SIZE];
    secp256k1_ge pre_a_lam[ECMULT_CONST_TABLE_SIZE];
    secp256k1_fe global_z;
    int group, i;

    /* We're allowed to be non-constant time in the point, and the code below (in particular,
     * secp256k1_ecmult_const_odd_multiples_table_globalz) cannot deal with infinity in a
     * constant-time manner anyway. */
    if (secp256k1_ge_is_infinity(a)) {
        secp256k1_gej_set_infinity(r);
        return;
    }

    /* Compute v1 and v2. */
    secp256k1_scalar_add(&s, q, &secp256k1_ecmult_const_K);
    secp256k1_scalar_half(&s, &s);
    secp256k1_scalar_split_lambda(&v1, &v2, &s);
    secp256k1_scalar_add(&v1, &v1, &S_OFFSET);
    secp256k1_scalar_add(&v2, &v2, &S_OFFSET);

#ifdef VERIFY
    /* Verify that v1 and v2 are in range [0, 2^129-1]. */
    for (i = 129; i < 256; ++i) {
        VERIFY_CHECK(secp256k1_scalar_get_bits_limb32(&v1, i, 1) == 0);
        VERIFY_CHECK(secp256k1_scalar_get_bits_limb32(&v2, i, 1) == 0);
    }
#endif

    /* Calculate odd multiples of A and A*lambda.
     * All multiples are brought to the same Z 'denominator', which is stored
     * in global_z. Due to secp256k1' isomorphism we can do all operations pretending
     * that the Z coordinate was 1, use affine addition formulae, and correct
     * the Z coordinate of the result once at the end.
     */
    secp256k1_gej_set_ge(r, a);
    secp256k1_ecmult_const_odd_multiples_table_globalz(pre_a, &global_z, r);
    for (i = 0; i < ECMULT_CONST_TABLE_SIZE; i++) {
        secp256k1_ge_mul_lambda(&pre_a_lam[i], &pre_a[i]);
    }

    /* Next, we compute r = C_l(v1, A) + C_l(v2, lambda*A).
     *
     * We proceed in groups of ECMULT_CONST_GROUP_SIZE bits, operating on that many bits
     * at a time, from high in v1, v2 to low. Call these bits1 (from v1) and bits2 (from v2).
     *
     * Now note that ECMULT_CONST_TABLE_GET_GE(&t, pre_a, bits1) loads into t a point equal
     * to C_{ECMULT_CONST_GROUP_SIZE}(bits1, A), and analogously for pre_lam_a / bits2.
     * This means that all we need to do is add these looked up values together, multiplied
     * by 2^(ECMULT_GROUP_SIZE * group).
     */
    for (group = ECMULT_CONST_GROUPS - 1; group >= 0; --group) {
        /* Using the _var get_bits function is ok here, since it's only variable in offset and count, not in the scalar. */
        unsigned int bits1 = secp256k1_scalar_get_bits_var(&v1, group * ECMULT_CONST_GROUP_SIZE, ECMULT_CONST_GROUP_SIZE);
        unsigned int bits2 = secp256k1_scalar_get_bits_var(&v2, group * ECMULT_CONST_GROUP_SIZE, ECMULT_CONST_GROUP_SIZE);
        secp256k1_ge t;
        int j;

        ECMULT_CONST_TABLE_GET_GE(&t, pre_a, bits1);
        if (group == ECMULT_CONST_GROUPS - 1) {
            /* Directly set r in the first iteration. */
            secp256k1_gej_set_ge(r, &t);
        } else {
            /* Shift the result so far up. */
            for (j = 0; j < ECMULT_CONST_GROUP_SIZE; ++j) {
                secp256k1_gej_double(r, r);
            }
            secp256k1_gej_add_ge(r, r, &t);
        }
        ECMULT_CONST_TABLE_GET_GE(&t, pre_a_lam, bits2);
        secp256k1_gej_add_ge(r, r, &t);
    }

    /* Map the result back to the secp256k1 curve from the isomorphic curve. */
    secp256k1_fe_mul(&r->z, &r->z, &global_z);
}